

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

shared_ptr<duckdb::BaseFileReader,_true> __thiscall
duckdb::CSVMultiFileInfo::CreateReader
          (CSVMultiFileInfo *this,ClientContext *context,GlobalTableFunctionState *gstate_p,
          OpenFileInfo *file,idx_t file_idx,MultiFileBindData *bind_data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Alloc_hider _Var1;
  int iVar2;
  pointer pTVar3;
  MultiFileList *pMVar4;
  CSVBufferManager *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar5;
  shared_ptr<duckdb::BaseFileReader,_true> sVar6;
  bool local_47b;
  bool local_47a;
  undefined1 local_479;
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  string local_460;
  ClientContext *local_440;
  CSVReaderOptions options;
  
  local_440 = context;
  pTVar3 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  CSVReaderOptions::CSVReaderOptions(&options,(CSVReaderOptions *)(pTVar3 + 1));
  pMVar4 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&bind_data->file_list);
  iVar2 = (*pMVar4->_vptr_MultiFileList[5])(pMVar4);
  if ((char)iVar2 == '\x01') {
    options.auto_detect = false;
  }
  buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (file_idx == 0) {
    shared_ptr<duckdb::CSVBufferManager,_true>::operator=
              (&buffer_manager,(shared_ptr<duckdb::CSVBufferManager,_true> *)(pTVar3 + 0x23));
    if (buffer_manager.internal.
        super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_01 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&buffer_manager);
      CSVBufferManager::GetFilePath_abi_cxx11_(&local_460,this_01);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(file->path)._M_string_length) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar5 = false;
        }
        else {
          iVar2 = bcmp(local_460._M_dataplus._M_p,(file->path)._M_dataplus._M_p,
                       local_460._M_string_length);
          bVar5 = iVar2 != 0;
        }
      }
      else {
        bVar5 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p);
      }
      this_00._M_pi =
           buffer_manager.internal.
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (bVar5) {
        buffer_manager.internal.
        super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        buffer_manager.internal.
        super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
      }
    }
  }
  local_47a = *(bool *)((long)&gstate_p[7]._vptr_GlobalTableFunctionState + 1);
  local_47b = false;
  local_460._M_dataplus._M_p = (pointer)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVFileScan,std::allocator<duckdb::CSVFileScan>,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,duckdb::CSVReaderOptions,duckdb::MultiFileOptions_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::CSVSchema&,bool,duckdb::shared_ptr<duckdb::CSVBufferManager,true>,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_460._M_string_length,
             (CSVFileScan **)&local_460,(allocator<duckdb::CSVFileScan> *)&local_479,local_440,file,
             &options,&bind_data->file_options,&bind_data->names,&bind_data->types,
             (CSVSchema *)&pTVar3[0x24].column_ids,&local_47a,&buffer_manager,&local_47b);
  _Var1._M_p = local_460._M_dataplus._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_460._M_string_length + 8) =
           *(_Atomic_word *)(local_460._M_string_length + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_01679107;
    }
    else {
      *(_Atomic_word *)(local_460._M_string_length + 8) =
           *(_Atomic_word *)(local_460._M_string_length + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._M_string_length);
  }
LAB_01679107:
  *(pointer *)this = _Var1._M_p;
  *(size_type *)(this + 8) = local_460._M_string_length;
  if (buffer_manager.internal.
      super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (buffer_manager.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  CSVReaderOptions::~CSVReaderOptions(&options);
  sVar6.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar6.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> CSVMultiFileInfo::CreateReader(ClientContext &context, GlobalTableFunctionState &gstate_p,
                                                          const OpenFileInfo &file, idx_t file_idx,
                                                          const MultiFileBindData &bind_data) {
	auto &gstate = gstate_p.Cast<CSVGlobalState>();
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();

	auto options = csv_data.options;
	if (bind_data.file_list->GetExpandResult() == FileExpandResult::SINGLE_FILE) {
		options.auto_detect = false;
	}

	shared_ptr<CSVBufferManager> buffer_manager;
	if (file_idx == 0) {
		buffer_manager = csv_data.buffer_manager;
		if (buffer_manager && buffer_manager->GetFilePath() != file.path) {
			buffer_manager.reset();
		}
	}
	return make_shared_ptr<CSVFileScan>(context, file, std::move(options), bind_data.file_options, bind_data.names,
	                                    bind_data.types, csv_data.csv_schema, gstate.SingleThreadedRead(),
	                                    std::move(buffer_manager), false);
}